

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O0

int testUpdatableModelSpecVersion(void)

{
  set<long,_std::less<long>,_std::allocator<long>_> *this;
  bool bVar1;
  NeuralNetwork *pNVar2;
  ostream *poVar3;
  Result local_110;
  undefined4 local_e4;
  undefined1 local_e0 [8];
  Result res;
  set<long,_std::less<long>,_std::allocator<long>_> local_88;
  undefined1 local_40 [8];
  Model m;
  
  CoreML::Specification::Model::Model((Model *)local_40);
  buildBasicUpdatableModelWithCategoricalCrossEntropyAndSoftmax((Model *)local_40);
  pNVar2 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)local_40);
  addLearningRate<CoreML::Specification::NeuralNetwork>
            (pNVar2,kSgdOptimizer,0.699999988079071,0.0,1.0);
  pNVar2 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)local_40);
  local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_88._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_88._M_t._M_impl._0_8_ = 0;
  local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_88);
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>(pNVar2,kSgdOptimizer,10,5,100,&local_88);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_88);
  pNVar2 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)local_40);
  res.m_message.field_2._8_8_ = 0;
  this = (set<long,_std::less<long>,_std::allocator<long>_> *)((long)&res.m_message.field_2 + 8);
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(this);
  addEpochs<CoreML::Specification::NeuralNetwork>(pNVar2,100,1,100,this);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)((long)&res.m_message.field_2 + 8)
            );
  CoreML::Specification::Model::set_specificationversion((Model *)local_40,3);
  CoreML::Model::validate((Result *)local_e0,(Model *)local_40);
  bVar1 = CoreML::Result::good((Result *)local_e0);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x30a);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,"!((res).good())");
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    m._oneof_case_[0] = 1;
  }
  else {
    CoreML::Specification::Model::set_specificationversion((Model *)local_40,4);
    CoreML::Model::validate(&local_110,(Model *)local_40);
    CoreML::Result::operator=((Result *)local_e0,&local_110);
    CoreML::Result::~Result(&local_110);
    bVar1 = CoreML::Result::good((Result *)local_e0);
    if (bVar1) {
      m._oneof_case_[0] = 0;
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x30f);
      poVar3 = std::operator<<(poVar3,": error: ");
      poVar3 = std::operator<<(poVar3,"(res).good()");
      poVar3 = std::operator<<(poVar3," was false, expected true.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      m._oneof_case_[0] = 1;
    }
  }
  local_e4 = 1;
  CoreML::Result::~Result((Result *)local_e0);
  CoreML::Specification::Model::~Model((Model *)local_40);
  return m._oneof_case_[0];
}

Assistant:

int testUpdatableModelSpecVersion() {
    /*
     checks that an updatable model has correct spec version
     - MLMODEL_SPECIFICATION_VERSION_IOS13
     */

    Specification::Model m;
    buildBasicUpdatableModelWithCategoricalCrossEntropyAndSoftmax(m);
    // now add an updatable model parameter.
    addLearningRate(m.mutable_neuralnetwork(), Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(m.mutable_neuralnetwork(), Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(m.mutable_neuralnetwork(), 100, 1, 100, std::set<int64_t>());

    // now set incorrect spec version
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS12);

    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);  // "Model specification version for an updatable model must be '4' or above."

    // fix spec version
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    res = Model::validate(m);
    ML_ASSERT_GOOD(res);
    return 0;
}